

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDsdPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  If_DsdMan_t *pIVar4;
  char *pcVar5;
  uint local_44;
  int fVerbose;
  int fSecond;
  int fTtDump;
  int fOccurs;
  int Support;
  int Number;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fOccurs = 0;
  fTtDump = 0;
  fSecond = 0;
  fVerbose = 0;
  bVar1 = false;
  local_44 = 0;
  Extra_UtilGetoptReset();
LAB_00242d84:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"NSotbvh");
    if (iVar2 == -1) {
      if (bVar1) {
        pvVar3 = Abc_FrameReadManDsd2();
        if (pvVar3 == (void *)0x0) {
          Abc_Print(-1,"The DSD manager is not started.\n");
          return 0;
        }
        pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd2();
        If_DsdManPrint(pIVar4,(char *)0x0,fOccurs,fTtDump,fSecond,fVerbose,local_44);
      }
      else {
        pvVar3 = Abc_FrameReadManDsd();
        if (pvVar3 == (void *)0x0) {
          Abc_Print(-1,"The DSD manager is not started.\n");
          return 0;
        }
        pIVar4 = (If_DsdMan_t *)Abc_FrameReadManDsd();
        If_DsdManPrint(pIVar4,(char *)0x0,fOccurs,fTtDump,fSecond,fVerbose,local_44);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by a floating point number.\n");
        goto LAB_00242f84;
      }
      fOccurs = atoi(argv[globalUtilOptind]);
      iVar2 = fOccurs;
      break;
    default:
      goto LAB_00242f84;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a floating point number.\n");
        goto LAB_00242f84;
      }
      fTtDump = atoi(argv[globalUtilOptind]);
      iVar2 = fTtDump;
      break;
    case 0x62:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_00242d84;
    case 0x68:
      goto LAB_00242f84;
    case 0x6f:
      fSecond = fSecond ^ 1;
      goto LAB_00242d84;
    case 0x74:
      fVerbose = fVerbose ^ 1;
      goto LAB_00242d84;
    case 0x76:
      local_44 = local_44 ^ 1;
      goto LAB_00242d84;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_00242f84:
      Abc_Print(-2,"usage: dsd_ps [-NS num] [-obvh]\n");
      Abc_Print(-2,"\t         prints statistics of the DSD manager\n");
      Abc_Print(-2,"\t-N num : show structures whose ID divides by N [default = %d]\n",
                (ulong)(uint)fOccurs);
      Abc_Print(-2,"\t-S num : show structures whose support size is S [default = %d]\n",
                (ulong)(uint)fTtDump);
      pcVar5 = "no";
      if (fSecond != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-o     : toggles printing occurence distribution [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (fVerbose != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggles dumping truth tables [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggles processing second manager [default = %s]\n",pcVar5);
      pcVar5 = "no";
      if (local_44 != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDsdPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, Number = 0, Support = 0, fOccurs = 0, fTtDump = 0, fSecond = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NSotbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Number = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Number < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a floating point number.\n" );
                goto usage;
            }
            Support = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Support < 0 )
                goto usage;
            break;
        case 'o':
            fOccurs ^= 1;
            break;
        case 't':
            fTtDump ^= 1;
            break;
        case 'b':
            fSecond ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fSecond )
    {
        if ( !Abc_FrameReadManDsd2() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        If_DsdManPrint( (If_DsdMan_t *)Abc_FrameReadManDsd2(), NULL, Number, Support, fOccurs, fTtDump, fVerbose );
    }
    else
    {
        if ( !Abc_FrameReadManDsd() )
        {
            Abc_Print( -1, "The DSD manager is not started.\n" );
            return 0;
        }
        If_DsdManPrint( (If_DsdMan_t *)Abc_FrameReadManDsd(), NULL, Number, Support, fOccurs, fTtDump, fVerbose );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: dsd_ps [-NS num] [-obvh]\n" );
    Abc_Print( -2, "\t         prints statistics of the DSD manager\n" );
    Abc_Print( -2, "\t-N num : show structures whose ID divides by N [default = %d]\n",   Number );
    Abc_Print( -2, "\t-S num : show structures whose support size is S [default = %d]\n", Support );
    Abc_Print( -2, "\t-o     : toggles printing occurence distribution [default = %s]\n", fOccurs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggles dumping truth tables [default = %s]\n",            fTtDump? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggles processing second manager [default = %s]\n",       fSecond? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n",                  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}